

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O0

ze_result_t
validation_layer::zeMemOpenIpcHandle
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,ze_ipc_mem_handle_t handle,
          ze_ipc_memory_flags_t flags,void **pptr)

{
  ZEValidationEntryPoints *pZVar1;
  ze_ipc_mem_handle_t handle_00;
  size_type sVar2;
  ze_device_handle_t p_Var3;
  ze_device_handle_t p_Var4;
  ze_result_t zVar5;
  element_type *this;
  reference ppvVar6;
  pointer this_00;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined1 local_1a8 [68];
  ze_result_t local_164;
  size_type sStack_160;
  ze_result_t result_2;
  size_t i_1;
  ze_result_t local_114;
  undefined1 uStack_110;
  undefined1 uStack_10f;
  undefined1 uStack_10e;
  undefined1 uStack_10d;
  ze_result_t driver_result;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  ze_result_t local_cc;
  undefined1 auStack_c8 [4];
  ze_result_t result_1;
  ze_result_t local_84;
  size_type sStack_80;
  ze_result_t result;
  size_t i;
  size_type numValHandlers;
  ze_pfnMemOpenIpcHandle_t pfnOpenIpcHandle;
  allocator local_51;
  string local_50 [32];
  void **local_30;
  void **pptr_local;
  ze_device_handle_t p_Stack_20;
  ze_ipc_memory_flags_t flags_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  local_30 = pptr;
  pptr_local._4_4_ = flags;
  p_Stack_20 = hDevice;
  hDevice_local = (ze_device_handle_t)hContext;
  this = std::__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<loader::Logger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )(context + 0xd50));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_50,"zeMemOpenIpcHandle(hContext, hDevice, handle, flags, pptr)",&local_51);
  loader::Logger::log_trace(this,(string *)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  numValHandlers = *(size_type *)(context + 0x3f0);
  if (numValHandlers == 0) {
    hContext_local._4_4_ =
         logAndPropagateResult("zeMemOpenIpcHandle",ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);
  }
  else {
    i = std::
        vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
        ::size((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                *)(context + 0xd30));
    for (sStack_80 = 0; sStack_80 < i; sStack_80 = sStack_80 + 1) {
      ppvVar6 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_80);
      p_Var4 = hDevice_local;
      p_Var3 = p_Stack_20;
      pZVar1 = (*ppvVar6)->zeValidation;
      memcpy(auStack_c8,&handle,0x40);
      local_84 = (*pZVar1->_vptr_ZEValidationEntryPoints[200])
                           (pZVar1,p_Var4,p_Var3,(ulong)pptr_local._4_4_,local_30);
      if (local_84 != ZE_RESULT_SUCCESS) {
        zVar5 = logAndPropagateResult("zeMemOpenIpcHandle",local_84);
        return zVar5;
      }
      local_84 = 0;
    }
    if ((*(byte *)(context + 4) & 1) != 0) {
      this_00 = std::
                unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                ::operator->((unique_ptr<validation_layer::HandleLifetimeValidation,_std::default_delete<validation_layer::HandleLifetimeValidation>_>
                              *)(context + 0xd48));
      p_Var4 = hDevice_local;
      p_Var3 = p_Stack_20;
      memcpy(&stack0xfffffffffffffef0,&handle,0x40);
      uVar17 = (undefined4)local_e0;
      uVar18 = (undefined4)((ulong)local_e0 >> 0x20);
      uVar19 = (undefined4)uStack_d8;
      uVar20 = (undefined4)((ulong)uStack_d8 >> 0x20);
      uVar13 = (undefined4)local_f0;
      uVar14 = (undefined4)((ulong)local_f0 >> 0x20);
      uVar15 = (undefined4)uStack_e8;
      uVar16 = (undefined4)((ulong)uStack_e8 >> 0x20);
      uVar9 = (undefined4)local_100;
      uVar10 = (undefined4)((ulong)local_100 >> 0x20);
      uVar11 = (undefined4)uStack_f8;
      uVar12 = (undefined4)((ulong)uStack_f8 >> 0x20);
      uVar7 = (undefined4)uStack_108;
      uVar8 = (undefined4)((ulong)uStack_108 >> 0x20);
      handle_00.data[8] = (char)uVar7;
      handle_00.data[9] = (char)((uint)uVar7 >> 8);
      handle_00.data[10] = (char)((uint)uVar7 >> 0x10);
      handle_00.data[0xb] = (char)((uint)uVar7 >> 0x18);
      handle_00.data[0] = uStack_110;
      handle_00.data[1] = uStack_10f;
      handle_00.data[2] = uStack_10e;
      handle_00.data[3] = uStack_10d;
      handle_00.data[4] = (undefined1)driver_result;
      handle_00.data[5] = driver_result._1_1_;
      handle_00.data[6] = driver_result._2_1_;
      handle_00.data[7] = driver_result._3_1_;
      handle_00.data[0xc] = (char)uVar8;
      handle_00.data[0xd] = (char)((uint)uVar8 >> 8);
      handle_00.data[0xe] = (char)((uint)uVar8 >> 0x10);
      handle_00.data[0xf] = (char)((uint)uVar8 >> 0x18);
      handle_00.data[0x10] = (char)uVar9;
      handle_00.data[0x11] = (char)((uint)uVar9 >> 8);
      handle_00.data[0x12] = (char)((uint)uVar9 >> 0x10);
      handle_00.data[0x13] = (char)((uint)uVar9 >> 0x18);
      handle_00.data[0x14] = (char)uVar10;
      handle_00.data[0x15] = (char)((uint)uVar10 >> 8);
      handle_00.data[0x16] = (char)((uint)uVar10 >> 0x10);
      handle_00.data[0x17] = (char)((uint)uVar10 >> 0x18);
      handle_00.data[0x18] = (char)uVar11;
      handle_00.data[0x19] = (char)((uint)uVar11 >> 8);
      handle_00.data[0x1a] = (char)((uint)uVar11 >> 0x10);
      handle_00.data[0x1b] = (char)((uint)uVar11 >> 0x18);
      handle_00.data[0x1c] = (char)uVar12;
      handle_00.data[0x1d] = (char)((uint)uVar12 >> 8);
      handle_00.data[0x1e] = (char)((uint)uVar12 >> 0x10);
      handle_00.data[0x1f] = (char)((uint)uVar12 >> 0x18);
      handle_00.data[0x20] = (char)uVar13;
      handle_00.data[0x21] = (char)((uint)uVar13 >> 8);
      handle_00.data[0x22] = (char)((uint)uVar13 >> 0x10);
      handle_00.data[0x23] = (char)((uint)uVar13 >> 0x18);
      handle_00.data[0x24] = (char)uVar14;
      handle_00.data[0x25] = (char)((uint)uVar14 >> 8);
      handle_00.data[0x26] = (char)((uint)uVar14 >> 0x10);
      handle_00.data[0x27] = (char)((uint)uVar14 >> 0x18);
      handle_00.data[0x28] = (char)uVar15;
      handle_00.data[0x29] = (char)((uint)uVar15 >> 8);
      handle_00.data[0x2a] = (char)((uint)uVar15 >> 0x10);
      handle_00.data[0x2b] = (char)((uint)uVar15 >> 0x18);
      handle_00.data[0x2c] = (char)uVar16;
      handle_00.data[0x2d] = (char)((uint)uVar16 >> 8);
      handle_00.data[0x2e] = (char)((uint)uVar16 >> 0x10);
      handle_00.data[0x2f] = (char)((uint)uVar16 >> 0x18);
      handle_00.data[0x30] = (char)uVar17;
      handle_00.data[0x31] = (char)((uint)uVar17 >> 8);
      handle_00.data[0x32] = (char)((uint)uVar17 >> 0x10);
      handle_00.data[0x33] = (char)((uint)uVar17 >> 0x18);
      handle_00.data[0x34] = (char)uVar18;
      handle_00.data[0x35] = (char)((uint)uVar18 >> 8);
      handle_00.data[0x36] = (char)((uint)uVar18 >> 0x10);
      handle_00.data[0x37] = (char)((uint)uVar18 >> 0x18);
      handle_00.data[0x38] = (char)uVar19;
      handle_00.data[0x39] = (char)((uint)uVar19 >> 8);
      handle_00.data[0x3a] = (char)((uint)uVar19 >> 0x10);
      handle_00.data[0x3b] = (char)((uint)uVar19 >> 0x18);
      handle_00.data[0x3c] = (char)uVar20;
      handle_00.data[0x3d] = (char)((uint)uVar20 >> 8);
      handle_00.data[0x3e] = (char)((uint)uVar20 >> 0x10);
      handle_00.data[0x3f] = (char)((uint)uVar20 >> 0x18);
      local_cc = ZEHandleLifetimeValidation::zeMemOpenIpcHandlePrologue
                           (&this_00->zeHandleLifetime,(ze_context_handle_t)p_Var4,p_Var3,handle_00,
                            pptr_local._4_4_,local_30);
      if (local_cc != ZE_RESULT_SUCCESS) {
        zVar5 = logAndPropagateResult("zeMemOpenIpcHandle",local_cc);
        return zVar5;
      }
      local_cc = 0;
    }
    p_Var4 = hDevice_local;
    p_Var3 = p_Stack_20;
    sVar2 = numValHandlers;
    memcpy(&i_1,&handle,0x40);
    local_114 = (*(code *)sVar2)(p_Var4,p_Var3,pptr_local._4_4_,local_30);
    for (sStack_160 = 0; sStack_160 < i; sStack_160 = sStack_160 + 1) {
      ppvVar6 = std::
                vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                ::operator[]((vector<validation_layer::validationChecker_*,_std::allocator<validation_layer::validationChecker_*>_>
                              *)(context + 0xd30),sStack_160);
      p_Var4 = hDevice_local;
      p_Var3 = p_Stack_20;
      pZVar1 = (*ppvVar6)->zeValidation;
      memcpy(local_1a8,&handle,0x40);
      local_164 = (*pZVar1->_vptr_ZEValidationEntryPoints[0xc9])
                            (pZVar1,p_Var4,p_Var3,(ulong)pptr_local._4_4_,local_30,(ulong)local_114)
      ;
      if (local_164 != ZE_RESULT_SUCCESS) {
        zVar5 = logAndPropagateResult("zeMemOpenIpcHandle",local_164);
        return zVar5;
      }
      local_164 = 0;
    }
    hContext_local._4_4_ = logAndPropagateResult("zeMemOpenIpcHandle",local_114);
  }
  return hContext_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemOpenIpcHandle(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to associate with the IPC memory handle
        ze_ipc_mem_handle_t handle,                     ///< [in] IPC memory handle
        ze_ipc_memory_flags_t flags,                    ///< [in] flags controlling the operation.
                                                        ///< must be 0 (default) or a valid combination of ::ze_ipc_memory_flag_t.
        void** pptr                                     ///< [out] pointer to device allocation in this process
        )
    {
        context.logger->log_trace("zeMemOpenIpcHandle(hContext, hDevice, handle, flags, pptr)");

        auto pfnOpenIpcHandle = context.zeDdiTable.Mem.pfnOpenIpcHandle;

        if( nullptr == pfnOpenIpcHandle )
            return logAndPropagateResult("zeMemOpenIpcHandle", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemOpenIpcHandlePrologue( hContext, hDevice, handle, flags, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemOpenIpcHandle", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zeHandleLifetime.zeMemOpenIpcHandlePrologue( hContext, hDevice, handle, flags, pptr );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemOpenIpcHandle", result);
        }

        auto driver_result = pfnOpenIpcHandle( hContext, hDevice, handle, flags, pptr );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zeValidation->zeMemOpenIpcHandleEpilogue( hContext, hDevice, handle, flags, pptr ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zeMemOpenIpcHandle", result);
        }

        return logAndPropagateResult("zeMemOpenIpcHandle", driver_result);
    }